

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall
util::ConstevalFormatString<1U>::Detail_CheckNumFormatSpecifiers
          (ConstevalFormatString<1U> *this,string_view str)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar10 = (byte *)str._M_len + (long)&this->fmt;
  uVar3 = 0;
  uVar5 = 0;
  pbVar9 = (byte *)str._M_len;
  do {
    while( true ) {
      do {
        do {
          pbVar8 = pbVar9;
          if (pbVar10 <= pbVar8) {
            if ((uVar5 != 0) && (uVar3 != 0)) {
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00588f2a;
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar6 = "Format specifiers must be all positional or all non-positional!";
              goto LAB_00588e93;
            }
            if ((uVar5 | uVar3) == 1) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                return;
              }
              goto LAB_00588f2a;
            }
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00588f2a;
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            pcVar6 = "Format specifier count must match the argument count!";
            goto LAB_00588e93;
          }
          pbVar9 = pbVar8 + 1;
        } while (*pbVar8 != 0x25);
        if (pbVar10 <= pbVar9) goto LAB_00588e71;
        bVar1 = *pbVar9;
        pbVar9 = pbVar8 + 2;
      } while (bVar1 == 0x25);
      uVar7 = 0;
      while ((byte)(bVar1 - 0x30) < 10) {
        uVar7 = (uVar7 * 10 + (uint)bVar1) - 0x30;
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      }
      if (bVar1 == 0x24) break;
      uVar5 = uVar5 + 1;
    }
    if (uVar7 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00588f2a;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar6 = "Positional format specifier must have position of at least 1";
      goto LAB_00588e93;
    }
    if (uVar3 <= uVar7) {
      uVar3 = uVar7;
    }
  } while (pbVar9 < pbVar10);
LAB_00588e71:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_00588f2a:
    __stack_chk_fail();
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar6 = "Format specifier incorrectly terminated by end of string";
LAB_00588e93:
  *puVar4 = pcVar6;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

constexpr static void Detail_CheckNumFormatSpecifiers(std::string_view str)
    {
        unsigned count_normal{0}; // Number of "normal" specifiers, like %s
        unsigned count_pos{0};    // Max number in positional specifier, like %8$s
        for (auto it{str.begin()}; it < str.end();) {
            if (*it != '%') {
                ++it;
                continue;
            }

            if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            if (*it == '%') {
                // Percent escape: %%
                ++it;
                continue;
            }

            unsigned maybe_num{0};
            while ('0' <= *it && *it <= '9') {
                maybe_num *= 10;
                maybe_num += *it - '0';
                ++it;
            };

            if (*it == '$') {
                // Positional specifier, like %8$s
                if (maybe_num == 0) throw "Positional format specifier must have position of at least 1";
                count_pos = std::max(count_pos, maybe_num);
                if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            } else {
                // Non-positional specifier, like %s
                ++count_normal;
                ++it;
            }
            // The remainder "[flags][width][.precision][length]type" of the
            // specifier is not checked. Parsing continues with the next '%'.
        }
        if (count_normal && count_pos) throw "Format specifiers must be all positional or all non-positional!";
        unsigned count{count_normal | count_pos};
        if (num_params != count) throw "Format specifier count must match the argument count!";
    }